

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

VkGeometryFlagsKHR Diligent::GeometryFlagsToVkGeometryFlags(RAYTRACING_GEOMETRY_FLAGS Flags)

{
  VkGeometryFlagsKHR VVar1;
  ulong uVar2;
  undefined7 in_register_00000039;
  byte bVar3;
  byte bVar4;
  string msg;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000039,Flags) == 0) {
    VVar1 = 0;
  }
  else {
    uVar2 = CONCAT71(in_register_00000039,Flags) & 0xffffffff;
    VVar1 = 0;
    do {
      bVar3 = (byte)uVar2;
      bVar4 = -bVar3 & bVar3;
      if (bVar4 == 2) {
        VVar1 = VVar1 | 2;
      }
      else if (bVar4 == 1) {
        VVar1 = VVar1 | 1;
      }
      else {
        FormatString<char[22]>(&local_50,(char (*) [22])"unknown geometry flag");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"GeometryFlagsToVkGeometryFlags",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x6f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      uVar2 = (ulong)(bVar4 ^ bVar3);
    } while (bVar4 != bVar3);
  }
  return VVar1;
}

Assistant:

VkGeometryFlagsKHR GeometryFlagsToVkGeometryFlags(RAYTRACING_GEOMETRY_FLAGS Flags)
{
    static_assert(RAYTRACING_GEOMETRY_FLAG_LAST == RAYTRACING_GEOMETRY_FLAG_NO_DUPLICATE_ANY_HIT_INVOCATION,
                  "Please update the switch below to handle the new ray tracing geometry flag");

    VkGeometryFlagsKHR Result = 0;
    while (Flags != RAYTRACING_GEOMETRY_FLAG_NONE)
    {
        RAYTRACING_GEOMETRY_FLAGS FlagBit = ExtractLSB(Flags);
        switch (FlagBit)
        {
            // clang-format off
            case RAYTRACING_GEOMETRY_FLAG_OPAQUE:                          Result |= VK_GEOMETRY_OPAQUE_BIT_KHR;                          break;
            case RAYTRACING_GEOMETRY_FLAG_NO_DUPLICATE_ANY_HIT_INVOCATION: Result |= VK_GEOMETRY_NO_DUPLICATE_ANY_HIT_INVOCATION_BIT_KHR; break;
            // clang-format on
            default: UNEXPECTED("unknown geometry flag");
        }
    }
    return Result;
}